

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# software_interrupt.c
# Opt level: O3

void software_interrupt(arm7tdmi_t *state,uint8_t comment)

{
  uint value;
  
  if (gba_log_verbosity != 0) {
    printf("\x1b[0;33m[WARN]  adjusted pc: 0x%08X: SWI: 0x%X - %s\n\x1b[0;m",
           (ulong)((state->pc + (((state->cpsr).raw & 0x20) >> 3)) - 8),(ulong)comment,
           SWI_NAMES_rel + *(int *)(SWI_NAMES_rel + (ulong)comment * 4));
  }
  value = (state->cpsr).raw;
  (state->cpsr).raw = value & 0xffffffe0 | 0x13;
  set_spsr(state,value);
  state->lr_svc = (state->pc + (((state->cpsr).raw & 0x20) >> 4)) - 4;
  (state->cpsr).raw = (state->cpsr).raw & 0xffffff5f | 0x80;
  set_pc(state,8);
  return;
}

Assistant:

void software_interrupt(arm7tdmi_t* state, byte comment) {
    word adjusted_pc = state->pc - (state->cpsr.thumb ? 4 : 8);
    logwarn("adjusted pc: 0x%08X: SWI: 0x%X - %s", adjusted_pc, comment, SWI_NAMES[comment])
    status_register_t cpsr = state->cpsr;
    state->cpsr.mode = MODE_SUPERVISOR;
    set_spsr(state, cpsr.raw);

    state->lr_svc = state->pc - (state->cpsr.thumb ? 2 : 4);

    state->cpsr.thumb = 0;
    state->cpsr.disable_irq = 1;

    set_pc(state, 0x8); // SVC handler
}